

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::EvalConstantValInt64
          (ValidationState_t *this,uint32_t id,int64_t *val)

{
  long *plVar1;
  bool bVar2;
  const_iterator cVar3;
  long lVar4;
  long lVar5;
  uint32_t local_20;
  key_type_conflict local_1c;
  
  local_20 = id;
  cVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_20);
  if ((cVar3.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (plVar1 = *(long **)((long)cVar3.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                ._M_cur + 0x10), plVar1 == (long *)0x0)) {
    __assert_fail("0 && \"Instruction not found\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x577,
                  "bool spvtools::val::ValidationState_t::EvalConstantValInt64(uint32_t, int64_t *) const"
                 );
  }
  local_1c = *(key_type_conflict *)(plVar1 + 8);
  cVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_1c);
  if (((cVar3.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
        ._M_cur == (__node_type *)0x0) ||
      (*(long *)((long)cVar3.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                       ._M_cur + 0x10) == 0)) ||
     (*(short *)(*(long *)((long)cVar3.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                 ._M_cur + 0x10) + 0x3a) != 0x15)) {
LAB_0020a704:
    bVar2 = false;
  }
  else {
    if (*(short *)((long)plVar1 + 0x3a) == 0x2b) {
      lVar4 = *plVar1;
      lVar5 = plVar1[1] - lVar4 >> 2;
      if (lVar5 == 5) {
        lVar4 = *(long *)(lVar4 + 0xc);
      }
      else {
        if (lVar5 != 4) {
          __assert_fail("inst->words().size() == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                        ,0x586,
                        "bool spvtools::val::ValidationState_t::EvalConstantValInt64(uint32_t, int64_t *) const"
                       );
        }
        lVar4 = (long)*(int *)(lVar4 + 0xc);
      }
      *val = lVar4;
    }
    else {
      if (*(short *)((long)plVar1 + 0x3a) != 0x2e) goto LAB_0020a704;
      *val = 0;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ValidationState_t::EvalConstantValInt64(uint32_t id, int64_t* val) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    assert(0 && "Instruction not found");
    return false;
  }

  if (!IsIntScalarType(inst->type_id())) return false;

  if (inst->opcode() == spv::Op::OpConstantNull) {
    *val = 0;
  } else if (inst->opcode() != spv::Op::OpConstant) {
    // Spec constant values cannot be evaluated so don't consider constant for
    // static validation
    return false;
  } else if (inst->words().size() == 4) {
    *val = int32_t(inst->word(3));
  } else {
    assert(inst->words().size() == 5);
    const uint32_t lo_word = inst->word(3);
    const uint32_t hi_word = inst->word(4);
    *val = static_cast<int64_t>(uint64_t(lo_word) | uint64_t(hi_word) << 32);
  }
  return true;
}